

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

bool __thiscall TextField::update(TextField *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  Text *this_01;
  Vector2f VVar1;
  Vector2f *pVVar2;
  String *pSVar3;
  size_t sVar4;
  undefined3 in_register_00000009;
  undefined4 uVar5;
  uint uVar6;
  size_t index;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  FloatRect FVar21;
  float fStack_54;
  undefined1 auVar17 [16];
  
  uVar5 = CONCAT31(in_register_00000009,clicked);
  if ((((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') &&
      ((this->isEditable & 1U) != 0)) && (clicked)) {
    this_00 = &(this->super_UIComponent).super_Transformable;
    pVVar2 = sf::Transformable::getPosition(this_00);
    fVar13 = pVVar2->x;
    pVVar2 = sf::Transformable::getPosition(this_00);
    fVar12 = pVVar2->y;
    fStack_54 = 0.0;
    fVar14 = 0.0;
    FVar21 = sf::Shape::getGlobalBounds(&(this->background).super_Shape);
    fVar9 = FVar21.left;
    fVar10 = FVar21.top;
    fVar19 = (float)(mouseX - (int)fVar13);
    fVar20 = (float)(mouseY - (int)fVar12);
    fVar11 = FVar21.width + fVar9;
    fVar13 = FVar21.height + fVar10;
    fVar12 = fVar11;
    if (fVar11 <= fVar9) {
      fVar12 = fVar9;
    }
    auVar15._4_4_ = fVar13;
    auVar15._0_4_ = fVar11;
    auVar15._8_4_ = fStack_54 + extraout_XMM0_Dc;
    auVar15._12_4_ = fVar14 + extraout_XMM0_Dd;
    auVar16._8_4_ = extraout_XMM0_Dc;
    auVar16._0_8_ = FVar21._0_8_;
    auVar16._12_4_ = extraout_XMM0_Dd;
    auVar16 = minps(auVar15,auVar16);
    iVar7 = -(uint)(fVar19 < auVar16._0_4_);
    iVar8 = -(uint)(fVar20 < auVar16._4_4_);
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar7;
    auVar18._8_4_ = iVar8;
    auVar18._12_4_ = iVar8;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._4_4_ = iVar7;
    auVar17._0_4_ = iVar7;
    uVar5 = movmskpd(uVar5,auVar17);
    if (((fVar12 <= fVar19 | (byte)uVar5 | (byte)uVar5 >> 1) & 1) == 0) {
      if (fVar13 <= fVar10) {
        fVar13 = fVar10;
      }
      if (fVar20 < fVar13) {
        this_01 = &this->field;
        pSVar3 = sf::Text::getString(this_01);
        sf::String::getSize(pSVar3);
        fVar13 = 3.4028235e+38;
        index = 0;
        uVar6 = 1;
        iVar7 = 0;
        do {
          VVar1 = sf::Text::findCharacterPos(this_01,index);
          fVar12 = ABS(fVar19 - VVar1.x);
          if (fVar12 < fVar13) {
            iVar7 = uVar6 - 1;
            fVar13 = fVar12;
          }
          index = (size_t)uVar6;
          pSVar3 = sf::Text::getString(this_01);
          sVar4 = sf::String::getSize(pSVar3);
          uVar6 = uVar6 + 1;
        } while (index <= sVar4);
        this->caretPosition = iVar7;
        VVar1 = sf::Text::findCharacterPos(this_01,(long)iVar7);
        sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar1.x,2.0);
        this->selected = true;
        return false;
      }
    }
    if (this->selected == true) {
      this->selected = false;
    }
  }
  return false;
}

Assistant:

bool TextField::update(int mouseX, int mouseY, bool clicked) {
    if (visible && isEditable && clicked) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (background.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY))) {
            unsigned int closestIndex = 0;
            float closestDistance = numeric_limits<float>::max();
            for (unsigned int i = 0; i <= field.getString().getSize(); ++i) {
                float distance = fabs(mouseX - field.findCharacterPos(i).x);
                if (distance < closestDistance) {
                    closestIndex = i;
                    closestDistance = distance;
                }
            }
            caretPosition = closestIndex;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
            selected = true;
        } else if (selected) {
            selected = false;
        }
    }
    return false;
}